

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void calc4::EmitCppCode<int>
               (shared_ptr<const_calc4::Operator> *op,CompilationContext *context,ostream *ostream)

{
  pointer pOVar1;
  VariableName name;
  element_type *peVar2;
  long lVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>_>
  *pmVar4;
  pointer pOVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  _Elt_pointer piVar9;
  string *__args_2;
  _Self __tmp;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  __i;
  long lVar10;
  pointer pOVar11;
  pointer info;
  pointer info_00;
  UserDefinedVariableName name_00;
  string local_102;
  allocator<char> local_101;
  CompilationContext *local_100;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  infos;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  variableNames;
  undefined1 local_a8 [32];
  undefined8 local_88;
  stack<int,_std::deque<int,_std::allocator<int>_>_> local_80;
  
  local_100 = context;
  poVar6 = std::operator<<(ostream,"#include <cstdint>");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,"#include <iostream>");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,"#include <unordered_map>");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>(ostream);
  poVar6 = std::operator<<(ostream,"std::unordered_map<");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"int32_t",7);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"int32_t",7);
  poVar6 = std::operator<<(poVar6,"> ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Memory",6);
  poVar6 = std::operator<<(poVar6,';');
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>(ostream);
  poVar6 = std::operator<<(ostream,"int ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"GetChar",7);
  poVar6 = std::operator<<(poVar6,"()");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,"{");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  poVar6 = std::operator<<(poVar6,"return std::cin.get();");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,"}");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>(ostream);
  poVar6 = std::operator<<(ostream,"void ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Print",5);
  poVar6 = std::operator<<(poVar6,"(");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"int32_t",7);
  poVar6 = std::operator<<(poVar6," value)");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,'{');
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  poVar6 = std::operator<<(poVar6,"std::cout << static_cast<char>(value);");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,'}');
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>(ostream);
  infos.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  infos.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  infos.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&variableNames,
             (basic_string_view<char,_std::char_traits<char>_> *)
             (anonymous_namespace)::MainOperatorName,&local_101);
  std::__cxx11::string::string((string *)local_a8,(string *)&variableNames);
  local_88 = (ulong)local_88._4_4_ << 0x20;
  __args_2 = &local_102;
  local_102 = (string)0x1;
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
  ::emplace_back<calc4::OperatorDefinition,std::shared_ptr<calc4::Operator_const>const&,bool>
            ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
              *)&infos,(OperatorDefinition *)local_a8,op,(bool *)__args_2);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&variableNames);
  pmVar4 = &local_100->userDefinedOperators;
  for (p_Var7 = (local_100->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      pOVar5 = infos.
               super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      info_00 = infos.
                super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var7 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
    __args_2 = (string *)local_a8;
    std::
    vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
    ::
    emplace_back<calc4::OperatorDefinition_const&,std::shared_ptr<calc4::Operator_const>const&,bool>
              ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
                *)&infos,(OperatorDefinition *)(p_Var7 + 2),
               (shared_ptr<const_calc4::Operator> *)&p_Var7[3]._M_parent,(bool *)local_a8);
  }
  pOVar1 = infos.
           super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  info = info_00;
  if (pOVar1 != infos.
                super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    lVar10 = (long)infos.
                   super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1;
    uVar8 = lVar10 >> 6;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<int>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
              (pOVar1,infos.
                      super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<int>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar1,pOVar5);
    }
    else {
      pOVar11 = info_00 + 0x11;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<int>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar1,pOVar11);
      for (; pOVar11 != pOVar5; pOVar11 = pOVar11 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Val_comp_iter<calc4::EmitCppCode<int>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                  (pOVar11);
      }
    }
  }
  for (; info != pOVar5; info = info + 1) {
    anon_unknown_0::EmitDeclaration<int>(info,ostream);
    poVar6 = std::operator<<(ostream,';');
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::endl<char,std::char_traits<char>>(ostream);
  anon_unknown_0::GatherVariableNames(&variableNames,op,local_100);
  if (variableNames._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var7 = variableNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &variableNames._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"int32_t",7);
      poVar6 = std::operator<<(poVar6,' ');
      name_00.name._M_str = (char *)__args_2;
      name_00.name._M_len = (size_t)p_Var7[1]._M_parent;
      poVar6 = anon_unknown_0::operator<<
                         ((anon_unknown_0 *)poVar6,*(ostream **)(p_Var7 + 1),name_00);
      poVar6 = std::operator<<(poVar6," = 0;");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::endl<char,std::char_traits<char>>(ostream);
  }
  poVar6 = std::operator<<(ostream,"int main()");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,'{');
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  poVar6 = std::operator<<(poVar6,"std::cout << ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,"main_operator",0xd);
  poVar6 = std::operator<<(poVar6,"() << std::endl;");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(ostream,'}');
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  for (; info_00 != pOVar5; info_00 = info_00 + 1) {
    if (info_00->isMain == false) {
      std::endl<char,std::char_traits<char>>(ostream);
    }
    anon_unknown_0::EmitDeclaration<int>(info_00,ostream);
    std::endl<char,std::char_traits<char>>(ostream);
    poVar6 = std::operator<<(ostream,'{');
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"Entry",5);
    poVar6 = std::operator<<(poVar6,':');
    std::endl<char,std::char_traits<char>>(poVar6);
    local_a8._0_8_ = &PTR_Visit_00148a18;
    local_a8._16_8_ = local_100;
    local_88 = -0xffffffff;
    local_a8._8_8_ = info_00;
    local_a8._24_8_ = ostream;
    std::stack<int,std::deque<int,std::allocator<int>>>::
    stack<std::deque<int,std::allocator<int>>,void>(&local_80);
    peVar2 = (info_00->op).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar2->_vptr_Operator)(peVar2,(Visitor<int> *)local_a8);
    piVar9 = local_80.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (local_80.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        local_80.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      piVar9 = local_80.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    name.no = piVar9[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&local_80.c);
    if (-1 < name.no) {
      poVar6 = anon_unknown_0::Visitor<int>::Append((Visitor<int> *)local_a8);
      poVar6 = std::operator<<(poVar6,"return ");
      poVar6 = anon_unknown_0::operator<<(poVar6,name);
      poVar6 = std::operator<<(poVar6,';');
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    poVar6 = std::operator<<(ostream,'}');
    std::endl<char,std::char_traits<char>>(poVar6);
    anon_unknown_0::Visitor<int>::~Visitor((Visitor<int> *)local_a8);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&variableNames._M_t);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::~vector(&infos);
  return;
}

Assistant:

void EmitCppCode(const std::shared_ptr<const Operator>& op, const CompilationContext& context,
                 std::ostream& ostream)
{
    /* Emit header */
    ostream << "#include <cstdint>" << std::endl;

#ifdef ENABLE_GMP
    if constexpr (std::is_same_v<TNumber, mpz_class>)
    {
        ostream << "#include <gmpxx.h>" << std::endl;
    }
#endif // ENABLE_GMP

    ostream << "#include <iostream>" << std::endl;
    ostream << "#include <unordered_map>" << std::endl;
    ostream << std::endl;
    ostream << "std::unordered_map<" << TypeName<TNumber>() << ", " << TypeName<TNumber>() << "> "
            << MemoryFieldName() << ';' << std::endl;
    ostream << std::endl;
    ostream << "int " << GetCharFunctionName() << "()" << std::endl;
    ostream << "{" << std::endl;
    ostream << IndentText << "return std::cin.get();" << std::endl;
    ostream << "}" << std::endl;
    ostream << std::endl;
    ostream << "void " << PrintFunctionName() << "(" << TypeName<TNumber>() << " value)"
            << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << static_cast<char>(value);" << std::endl;
    ostream << '}' << std::endl;
    ostream << std::endl;

    /* Gather information of operators and sort */
    std::vector<OperatorInformation> infos;
    infos.emplace_back(OperatorDefinition(std::string(MainOperatorName), 0), op, true);

    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        infos.emplace_back(it->second.GetDefinition(), it->second.GetOperator(), false);
    }

    std::sort(infos.begin() + 1, infos.end(), [](auto& left, auto& right) {
        return left.definition.GetName() < right.definition.GetName();
    });

    /* Emit forward declarations */
    for (auto& info : infos)
    {
        EmitDeclaration<TNumber>(info, ostream);
        ostream << ';' << std::endl;
    }

    ostream << std::endl;

    /* Gather variable names */
    std::set<std::string_view> variableNames = GatherVariableNames(op, context);

    /* Emit variable definitions */
    if (!variableNames.empty())
    {
        for (auto& variableName : variableNames)
        {
            ostream << TypeName<TNumber>() << ' ' << UserDefinedVariableName(variableName)
                    << " = 0;" << std::endl;
        }

        ostream << std::endl;
    }

    /* Emit main */
    ostream << "int main()" << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << " << MainOperatorName << "() << std::endl;" << std::endl;
    ostream << '}' << std::endl << std::endl;

    /* Emit definitions */
    for (auto& info : infos)
    {
        if (!info.isMain)
        {
            ostream << std::endl;
        }

        EmitOperator<TNumber>(info, context, ostream);
    }
}